

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O1

vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
* deqp::gles3::Performance::singleValueShaderAttributes
            (vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
             *__return_storage_ptr__,string *nameSpecialization)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  int iVar6;
  long lVar7;
  undefined1 **ppuVar8;
  Vector<float,_16> result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  float local_118 [18];
  AttribSpec local_d0;
  undefined1 *local_70;
  undefined1 *puStack_68;
  undefined1 *local_60;
  undefined1 *puStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  undefined1 *local_40;
  undefined1 *puStack_38;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&local_138,"a_position",nameSpecialization);
  local_40 = (undefined1 *)0xbf800000bf800000;
  puStack_38 = (undefined1 *)0x3f80000000000000;
  local_50 = (undefined1 *)0x3f800000bf800000;
  puStack_48 = (undefined1 *)0x3f80000000000000;
  local_60 = (undefined1 *)0xbf8000003f800000;
  puStack_58 = (undefined1 *)0x3f80000000000000;
  local_70 = &DAT_3f8000003f800000;
  puStack_68 = (undefined1 *)0x3f80000000000000;
  pfVar5 = local_118;
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_118[2] = 0.0;
  local_118[3] = 0.0;
  local_118[4] = 0.0;
  local_118[5] = 0.0;
  local_118[6] = 0.0;
  local_118[7] = 0.0;
  local_118[8] = 0.0;
  local_118[9] = 0.0;
  local_118[10] = 0.0;
  local_118[0xb] = 0.0;
  local_118[0xc] = 0.0;
  local_118[0xd] = 0.0;
  local_118[0xe] = 0.0;
  local_118[0xf] = 0.0;
  lVar7 = 0;
  do {
    iVar6 = (int)lVar7;
    ppuVar8 = &local_40;
    if (((iVar6 != 0) && (ppuVar8 = &local_50, iVar6 != 1)) && (ppuVar8 = &local_70, iVar6 == 2)) {
      ppuVar8 = &local_60;
    }
    fVar2 = *(float *)((long)ppuVar8 + 4);
    fVar3 = *(float *)(ppuVar8 + 1);
    fVar4 = *(float *)((long)ppuVar8 + 0xc);
    *pfVar5 = *(float *)ppuVar8;
    pfVar5[1] = fVar2;
    pfVar5[2] = fVar3;
    pfVar5[3] = fVar4;
    lVar7 = lVar7 + 1;
    pfVar5 = pfVar5 + 4;
  } while (lVar7 != 4);
  paVar1 = &local_d0.name.field_2;
  local_d0.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_138._M_dataplus._M_p,
             local_138._M_dataplus._M_p + local_138._M_string_length);
  local_d0.value.m_data[0xc] = local_118[0xc];
  local_d0.value.m_data[0xd] = local_118[0xd];
  local_d0.value.m_data[0xe] = local_118[0xe];
  local_d0.value.m_data[0xf] = local_118[0xf];
  local_d0.value.m_data[8] = local_118[8];
  local_d0.value.m_data[9] = local_118[9];
  local_d0.value.m_data[10] = local_118[10];
  local_d0.value.m_data[0xb] = local_118[0xb];
  local_d0.value.m_data[4] = local_118[4];
  local_d0.value.m_data[5] = local_118[5];
  local_d0.value.m_data[6] = local_118[6];
  local_d0.value.m_data[7] = local_118[7];
  local_d0.value.m_data[0] = local_118[0];
  local_d0.value.m_data[1] = local_118[1];
  local_d0.value.m_data[2] = local_118[2];
  local_d0.value.m_data[3] = local_118[3];
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            (__return_storage_ptr__,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.name._M_dataplus._M_p,local_d0.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_138,"a_value",nameSpecialization);
  local_40 = &DAT_3f8000003f800000;
  puStack_38 = &DAT_3f8000003f800000;
  local_50 = &DAT_3f8000003f800000;
  puStack_48 = &DAT_3f8000003f800000;
  local_60 = &DAT_3f8000003f800000;
  puStack_58 = &DAT_3f8000003f800000;
  local_70 = &DAT_3f8000003f800000;
  puStack_68 = &DAT_3f8000003f800000;
  pfVar5 = local_118;
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_118[2] = 0.0;
  local_118[3] = 0.0;
  local_118[4] = 0.0;
  local_118[5] = 0.0;
  local_118[6] = 0.0;
  local_118[7] = 0.0;
  local_118[8] = 0.0;
  local_118[9] = 0.0;
  local_118[10] = 0.0;
  local_118[0xb] = 0.0;
  local_118[0xc] = 0.0;
  local_118[0xd] = 0.0;
  local_118[0xe] = 0.0;
  local_118[0xf] = 0.0;
  lVar7 = 0;
  do {
    iVar6 = (int)lVar7;
    ppuVar8 = &local_40;
    if (((iVar6 != 0) && (ppuVar8 = &local_50, iVar6 != 1)) && (ppuVar8 = &local_70, iVar6 == 2)) {
      ppuVar8 = &local_60;
    }
    fVar2 = *(float *)((long)ppuVar8 + 4);
    fVar3 = *(float *)(ppuVar8 + 1);
    fVar4 = *(float *)((long)ppuVar8 + 0xc);
    *pfVar5 = *(float *)ppuVar8;
    pfVar5[1] = fVar2;
    pfVar5[2] = fVar3;
    pfVar5[3] = fVar4;
    lVar7 = lVar7 + 1;
    pfVar5 = pfVar5 + 4;
  } while (lVar7 != 4);
  local_d0.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_138._M_dataplus._M_p,
             local_138._M_dataplus._M_p + local_138._M_string_length);
  local_d0.value.m_data[0xc] = local_118[0xc];
  local_d0.value.m_data[0xd] = local_118[0xd];
  local_d0.value.m_data[0xe] = local_118[0xe];
  local_d0.value.m_data[0xf] = local_118[0xf];
  local_d0.value.m_data[8] = local_118[8];
  local_d0.value.m_data[9] = local_118[9];
  local_d0.value.m_data[10] = local_118[10];
  local_d0.value.m_data[0xb] = local_118[0xb];
  local_d0.value.m_data[4] = local_118[4];
  local_d0.value.m_data[5] = local_118[5];
  local_d0.value.m_data[6] = local_118[6];
  local_d0.value.m_data[7] = local_118[7];
  local_d0.value.m_data[0] = local_118[0];
  local_d0.value.m_data[1] = local_118[1];
  local_d0.value.m_data[2] = local_118[2];
  local_d0.value.m_data[3] = local_118[3];
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>
            (__return_storage_ptr__,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.name._M_dataplus._M_p,local_d0.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<ShaderCompilerCase::AttribSpec> singleValueShaderAttributes (const string& nameSpecialization)
{
	vector<ShaderCompilerCase::AttribSpec> result;

	result.push_back(ShaderCompilerCase::AttribSpec("a_position" + nameSpecialization,
													combineVec4ToVec16(Vec4(-1.0f, -1.0f,  0.0f,  1.0f),
																	   Vec4(-1.0f,  1.0f,  0.0f,  1.0f),
																	   Vec4( 1.0f, -1.0f,  0.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  0.0f,  1.0f))));

	result.push_back(ShaderCompilerCase::AttribSpec("a_value" + nameSpecialization,
													combineVec4ToVec16(Vec4( 1.0f,  1.0f,  1.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  1.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  1.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  1.0f,  1.0f))));

	return result;
}